

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin.pb.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::CodeGeneratorRequest::SerializeWithCachedSizes
          (CodeGeneratorRequest *this,CodedOutputStream *output)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  string *psVar4;
  FileDescriptorProto *value;
  UnknownFieldSet *pUVar5;
  int local_20;
  int local_1c;
  int i_1;
  int i;
  CodedOutputStream *output_local;
  CodeGeneratorRequest *this_local;
  
  for (local_1c = 0; iVar2 = file_to_generate_size(this), local_1c < iVar2; local_1c = local_1c + 1)
  {
    file_to_generate_abi_cxx11_(this,local_1c);
    pcVar3 = (char *)std::__cxx11::string::data();
    file_to_generate_abi_cxx11_(this,local_1c);
    iVar2 = std::__cxx11::string::length();
    internal::WireFormat::VerifyUTF8String(pcVar3,iVar2,SERIALIZE);
    psVar4 = file_to_generate_abi_cxx11_(this,local_1c);
    internal::WireFormatLite::WriteString(1,psVar4,output);
  }
  bVar1 = has_parameter(this);
  if (bVar1) {
    parameter_abi_cxx11_(this);
    pcVar3 = (char *)std::__cxx11::string::data();
    parameter_abi_cxx11_(this);
    iVar2 = std::__cxx11::string::length();
    internal::WireFormat::VerifyUTF8String(pcVar3,iVar2,SERIALIZE);
    psVar4 = parameter_abi_cxx11_(this);
    internal::WireFormatLite::WriteString(2,psVar4,output);
  }
  for (local_20 = 0; iVar2 = proto_file_size(this), local_20 < iVar2; local_20 = local_20 + 1) {
    value = proto_file(this,local_20);
    internal::WireFormatLite::WriteMessageMaybeToArray(0xf,(MessageLite *)value,output);
  }
  pUVar5 = unknown_fields(this);
  bVar1 = UnknownFieldSet::empty(pUVar5);
  if (!bVar1) {
    pUVar5 = unknown_fields(this);
    internal::WireFormat::SerializeUnknownFields(pUVar5,output);
  }
  return;
}

Assistant:

void CodeGeneratorRequest::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // repeated string file_to_generate = 1;
  for (int i = 0; i < this->file_to_generate_size(); i++) {
  ::google::protobuf::internal::WireFormat::VerifyUTF8String(
    this->file_to_generate(i).data(), this->file_to_generate(i).length(),
    ::google::protobuf::internal::WireFormat::SERIALIZE);
    ::google::protobuf::internal::WireFormatLite::WriteString(
      1, this->file_to_generate(i), output);
  }

  // optional string parameter = 2;
  if (has_parameter()) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8String(
      this->parameter().data(), this->parameter().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE);
    ::google::protobuf::internal::WireFormatLite::WriteString(
      2, this->parameter(), output);
  }

  // repeated .google.protobuf.FileDescriptorProto proto_file = 15;
  for (int i = 0; i < this->proto_file_size(); i++) {
    ::google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray(
      15, this->proto_file(i), output);
  }

  if (!unknown_fields().empty()) {
    ::google::protobuf::internal::WireFormat::SerializeUnknownFields(
        unknown_fields(), output);
  }
}